

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void * lj_mem_realloc(lua_State *L,void *p,GCSize osz,GCSize nsz)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined8 *)(L->glref).ptr64;
  pvVar2 = (void *)(*(code *)*puVar1)(puVar1[1]);
  if ((nsz != 0) && (pvVar2 == (void *)0x0)) {
    lj_err_mem(L);
  }
  puVar1[2] = puVar1[2] + (nsz - osz);
  return pvVar2;
}

Assistant:

void *lj_mem_realloc(lua_State *L, void *p, GCSize osz, GCSize nsz)
{
  global_State *g = G(L);
  lj_assertG((osz == 0) == (p == NULL), "realloc API violation");
  p = g->allocf(g->allocd, p, osz, nsz);
  if (p == NULL && nsz > 0)
    lj_err_mem(L);
  lj_assertG((nsz == 0) == (p == NULL), "allocf API violation");
  lj_assertG(checkptrGC(p),
	     "allocated memory address %p outside required range", p);
  g->gc.total = (g->gc.total - osz) + nsz;
  return p;
}